

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Strings.cc
# Opt level: O3

uint8_t phosg::value_for_hex_char(char x)

{
  byte bVar1;
  out_of_range *this;
  undefined7 in_register_00000039;
  string sStack_38;
  
  bVar1 = x - 0x30;
  if (9 < bVar1) {
    if ((byte)(x + 0xbfU) < 6) {
      bVar1 = x - 0x37;
    }
    else {
      if (5 < (byte)(x + 0x9fU)) {
        this = (out_of_range *)__cxa_allocate_exception(0x10);
        string_printf_abi_cxx11_
                  (&sStack_38,"invalid hex char: %c",CONCAT71(in_register_00000039,x) & 0xffffffff);
        ::std::out_of_range::out_of_range(this,(string *)&sStack_38);
        __cxa_throw(this,&::std::out_of_range::typeinfo,::std::out_of_range::~out_of_range);
      }
      bVar1 = x + 0xa9;
    }
  }
  return bVar1;
}

Assistant:

uint8_t value_for_hex_char(char x) {
  if (x >= '0' && x <= '9') {
    return x - '0';
  }
  if (x >= 'A' && x <= 'F') {
    return (x - 'A') + 0xA;
  }
  if (x >= 'a' && x <= 'f') {
    return (x - 'a') + 0xA;
  }
  throw out_of_range(string_printf("invalid hex char: %c", x));
}